

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

StatusOr<double> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseFp<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  bool bVar1;
  char cVar2;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa;
  string_view sVar3;
  StatusOr<double> SVar4;
  Status _status_1;
  double n;
  Status _status;
  undefined1 local_80 [80];
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  
  JsonLexer::PeekKind((JsonLexer *)&kind);
  absl::lts_20240722::Status::Status(&_status,(Status *)&kind);
  if (_status.rep_ == 1) {
    absl::lts_20240722::Status::~Status(&_status);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
              (&kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>);
    if (kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.field_1.data_ ==
        kStr) {
      JsonLexer::ParseUtf8
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&_status,lex);
      absl::lts_20240722::Status::Status(&_status_1,&_status);
      if (_status_1.rep_ != 1) {
        absl::lts_20240722::internal_statusor::StatusOrData<double>::
        StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status_1);
LAB_002932b0:
        absl::lts_20240722::Status::~Status(&_status_1);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&_status);
        goto LAB_0029323e;
      }
      absl::lts_20240722::Status::~Status(&_status_1);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&_status);
      bVar1 = json_internal::operator==
                        (&(((anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
                             *)local_80)->data_).value,(char (*) [4])"NaN");
      if (bVar1) {
        n = NAN;
      }
      else {
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&_status);
        bVar1 = json_internal::operator==
                          (&(((anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
                               *)local_80)->data_).value,(char (*) [9])0x3b497a);
        if (bVar1) {
          n = INFINITY;
        }
        else {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&_status);
          bVar1 = json_internal::operator==
                            (&(((anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
                                 *)local_80)->data_).value,(char (*) [10])"-Infinity");
          if (bVar1) {
            n = -INFINITY;
          }
          else {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&_status);
            sVar3 = MaybeOwnedString::AsView
                              (&(((anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
                                   *)local_80)->data_).value);
            cVar2 = absl::lts_20240722::SimpleAtod(sVar3._M_len,sVar3._M_str,&n);
            if (cVar2 == '\0') {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&_status);
              JsonLocation::Invalid
                        ((JsonLocation *)&_status_1,
                         &(((anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
                             *)local_80)->data_).loc,0x26,"non-number characters in quoted number");
              absl::lts_20240722::internal_statusor::StatusOrData<double>::
              StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status_1);
              goto LAB_002932b0;
            }
          }
        }
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&_status);
LAB_002931a7:
      if ((((8 < *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) ||
           ((0x14aU >> (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) &
                       0x1f) & 1) == 0)) || (0x7fefffffffffffff < (ulong)ABS(n))) ||
         ((uint)ABS((float)n) < 0x7f800000)) {
        *(double *)(this + 8) = n;
        *(undefined8 *)this = 1;
        goto LAB_0029323e;
      }
      JsonLocation::Invalid((JsonLocation *)&_status,&lex->json_loc_,0x12,"float out of range");
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status);
    }
    else if (kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.field_1.data_
             == kNum) {
      JsonLexer::ParseNumber
                ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&_status,lex);
      absl::lts_20240722::Status::Status(&_status_1,&_status);
      if (_status_1.rep_ == 1) {
        absl::lts_20240722::Status::~Status(&_status_1);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::EnsureOk
                  ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)&_status)
        ;
        n = (double)local_80._0_8_;
        absl::lts_20240722::Status::~Status(&_status);
        goto LAB_002931a7;
      }
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status_1);
      absl::lts_20240722::Status::~Status(&_status_1);
    }
    else {
      JsonLocation::Invalid
                ((JsonLocation *)&_status,&lex->json_loc_,0x19,"expected number or string");
      absl::lts_20240722::internal_statusor::StatusOrData<double>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<double>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<double> *)this,&_status);
  }
  absl::lts_20240722::Status::~Status(&_status);
LAB_0029323e:
  absl::lts_20240722::Status::~Status((Status *)&kind);
  SVar4.super_StatusOrData<double>.field_1.data_ = extraout_XMM0_Qa.data_;
  SVar4.super_StatusOrData<double>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<double>_1)this;
  return (StatusOr<double>)SVar4.super_StatusOrData<double>;
}

Assistant:

absl::StatusOr<double> ParseFp(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<JsonLexer::Kind> kind = lex.PeekKind();
  RETURN_IF_ERROR(kind.status());

  double n;
  switch (*kind) {
    case JsonLexer::kNum: {
      absl::StatusOr<LocationWith<double>> d = lex.ParseNumber();
      RETURN_IF_ERROR(d.status());
      n = d->value;
      break;
    }
    case JsonLexer::kStr: {
      absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
      RETURN_IF_ERROR(str.status());

      if (str->value == "NaN") {
        n = NAN;
      } else if (str->value == "Infinity") {
        n = INFINITY;
      } else if (str->value == "-Infinity") {
        n = -INFINITY;
      } else if (!absl::SimpleAtod(str->value.AsView(), &n)) {
        return str->loc.Invalid("non-number characters in quoted number");
      }
      break;
    }
    default:
      return lex.Invalid("expected number or string");
  }

  if (Traits::Is32Bit(field)) {
    // Detect out-of-range 32-bit floats by seeing whether the conversion result
    // is still finite. Finite extreme values may have textual representations
    // that parse to 64-bit values outside the 32-bit range, but which are
    // closer to the 32-bit extreme than to the "next value with the same
    // precision".
    if (std::isfinite(n) && !std::isfinite(static_cast<float>(n))) {
      return lex.Invalid("float out of range");
    }
  }

  return n;
}